

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_hash.c
# Opt level: O0

FIOBJ fiobj_hash_replace(FIOBJ hash,FIOBJ key,FIOBJ obj)

{
  size_t sVar1;
  ulong uVar2;
  uint64_t hash_value;
  FIOBJ local_28;
  FIOBJ old;
  FIOBJ obj_local;
  FIOBJ key_local;
  FIOBJ hash_local;
  
  old = obj;
  obj_local = key;
  key_local = hash;
  if (hash != 0) {
    sVar1 = fiobj_type_is(hash,FIOBJ_T_HASH);
    if (sVar1 != 0) {
      local_28 = 0;
      uVar2 = key_local & 0xfffffffffffffff8;
      hash_value = fiobj_obj2hash(obj_local);
      fio_hash___insert((fio_hash___s *)(uVar2 + 8),hash_value,obj_local,old,&local_28);
      fiobj_free(old);
      return local_28;
    }
  }
  __assert_fail("hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/spujadas[P]rshutdown/facil/lib/facil/fiobj/fiobj_hash.c"
                ,0xf0,"FIOBJ fiobj_hash_replace(FIOBJ, FIOBJ, FIOBJ)");
}

Assistant:

FIOBJ fiobj_hash_replace(FIOBJ hash, FIOBJ key, FIOBJ obj) {
  assert(hash && FIOBJ_TYPE_IS(hash, FIOBJ_T_HASH));
  FIOBJ old = FIOBJ_INVALID;
  fio_hash___insert(&obj2hash(hash)->hash, fiobj_obj2hash(key), key, obj, &old);
  fiobj_free(obj); /* take ownership - free the user's reference. */
  return old;
}